

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnInitExprI32ConstExpr
          (BinaryReaderIR *this,Index index,uint32_t value)

{
  _func_int **__s;
  ExprList *pEVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  ExprList *pEVar5;
  
  __s = (_func_int **)this->filename_;
  pEVar3 = (Expr *)strlen((char *)__s);
  pEVar1 = this->current_init_expr_;
  pEVar2 = (Expr *)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  pEVar4 = (Expr *)operator_new(0x88);
  (pEVar4->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar4->loc).filename.data_ = (char *)__s;
  (pEVar4->loc).filename.size_ = (size_type)pEVar3;
  (pEVar4->loc).field_1.field_1.offset = (size_t)pEVar2;
  *(undefined8 *)((long)&(pEVar4->loc).field_1 + 8) = 0;
  pEVar4->type_ = Const;
  pEVar4->_vptr_Expr = (_func_int **)&PTR__Expr_00199f08;
  pEVar4[1]._vptr_Expr = __s;
  pEVar4[1].super_intrusive_list_base<wabt::Expr>.next_ = pEVar3;
  pEVar4[1].super_intrusive_list_base<wabt::Expr>.prev_ = pEVar2;
  pEVar4[1].loc.filename.data_ = (char *)0x0;
  *(undefined4 *)&pEVar4[1].loc.filename.size_ = 0xffffffff;
  pEVar4[1].loc.field_1.field_0.line = value;
  pEVar4[1].type_ = AtomicLoad;
  if (((pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar4->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar2 = pEVar1->last_;
    pEVar5 = pEVar1;
    if (pEVar2 != (Expr *)0x0) {
      (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
      pEVar5 = (ExprList *)&pEVar2->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar5->first_ = pEVar4;
    pEVar1->last_ = pEVar4;
    pEVar1->size_ = pEVar1->size_ + 1;
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnInitExprI32ConstExpr(Index index, uint32_t value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::I32(value, loc), loc));
  return Result::Ok;
}